

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  Allocator *pAVar6;
  Proposal *pPVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 extraout_var [12];
  Mat local_b8;
  Proposal *local_70;
  void *local_68;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar8 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar8;
  iVar8 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar8;
  iVar8 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar8;
  iVar8 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar8;
  fVar14 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar14;
  iVar8 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar8;
  iVar8 = this->base_size;
  uVar2 = (this->ratios).w;
  uVar3 = (this->scales).w;
  local_b8.cstep = 0;
  local_b8.data = (float *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  local_70 = this;
  Mat::create(&local_b8,4,uVar3 * uVar2,4,(Allocator *)0x0);
  if (0 < (int)uVar2) {
    local_58 = (float)iVar8 * 0.5;
    local_68 = (local_70->ratios).data;
    pvVar4 = (local_70->scales).data;
    lVar12 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    local_60 = lVar12 * (ulong)uVar3;
    uVar13 = 0;
    pfVar11 = (float *)local_b8.data;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)uVar3) {
        fVar14 = *(float *)((long)local_68 + uVar13 * 4);
        auVar17 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar14));
        fVar15 = auVar17._0_4_;
        fVar15 = roundf(fVar15 * -0.5 * (float)iVar8 * (fVar14 * fVar15 * fVar15 + -3.0));
        local_48 = (float)(int)fVar15;
        fStack_44 = (float)(int)extraout_var._0_4_;
        fStack_40 = (float)(int)extraout_var._4_4_;
        fStack_3c = (float)(int)extraout_var._8_4_;
        fVar14 = roundf(fVar14 * local_48);
        uVar10 = 0;
        pfVar9 = pfVar11;
        do {
          fVar15 = *(float *)((long)pvVar4 + uVar10 * 4) * 0.5;
          fVar16 = fVar15 * local_48;
          fVar15 = fVar15 * (float)(int)fVar14;
          *pfVar9 = local_58 - fVar16;
          pfVar9[1] = fStack_54 - fVar15;
          pfVar9[2] = fVar16 + fStack_50;
          pfVar9[3] = fVar15 + fStack_4c;
          uVar10 = uVar10 + 1;
          pfVar9 = (float *)((long)pfVar9 + lVar12);
        } while (uVar3 != uVar10);
      }
      uVar13 = uVar13 + 1;
      pfVar11 = (float *)((long)pfVar11 + local_60);
    } while (uVar13 != uVar2);
  }
  pPVar7 = local_70;
  pMVar1 = &local_70->anchors;
  if (pMVar1 != &local_b8) {
    piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = (local_70->anchors).refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pvVar4 = (local_70->anchors).data;
        pAVar6 = (local_70->anchors).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*(long *)pAVar6 + 0x18))();
        }
      }
    }
    (pPVar7->anchors).cstep = 0;
    *(undefined8 *)((long)&(pPVar7->anchors).refcount + 4) = 0;
    *(undefined8 *)((long)&(pPVar7->anchors).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (pPVar7->anchors).refcount = (int *)0x0;
    (pPVar7->anchors).dims = 0;
    (pPVar7->anchors).w = 0;
    (pPVar7->anchors).h = 0;
    (pPVar7->anchors).d = 0;
    (pPVar7->anchors).c = 0;
    (pPVar7->anchors).data = local_b8.data;
    (pPVar7->anchors).refcount = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (pPVar7->anchors).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (pPVar7->anchors).elempack = local_b8.elempack;
    (pPVar7->anchors).allocator = local_b8.allocator;
    (pPVar7->anchors).dims = local_b8.dims;
    (pPVar7->anchors).w = local_b8.w;
    (pPVar7->anchors).h = local_b8.h;
    (pPVar7->anchors).d = local_b8.d;
    (pPVar7->anchors).c = local_b8.c;
    (pPVar7->anchors).cstep = local_b8.cstep;
  }
  piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((float *)local_b8.data != (float *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}